

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

char * kj::_::fill<kj::ArrayPtr<char16_t_const>,kj::StringPtr&,kj::StringPtr>
                 (char *target,Delimited<kj::ArrayPtr<const_char16_t>_> *first,StringPtr *rest,
                 StringPtr *rest_1)

{
  char *pcVar1;
  
  pcVar1 = Delimited<kj::ArrayPtr<const_char16_t>_>::flattenTo(first,target);
  pcVar1 = fill<kj::StringPtr,kj::StringPtr>(pcVar1,rest,rest_1);
  return pcVar1;
}

Assistant:

char* fill(char* __restrict__ target, Delimited<T>&& first, Rest&&... rest) {
  target = first.flattenTo(target);
  return fill(target, kj::fwd<Rest>(rest)...);
}